

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

RayTracingPipelineStateCreateInfoX * __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::SyncDesc
          (RayTracingPipelineStateCreateInfoX *this,SYNC_FLAGS UpdateFlags)

{
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *this_00;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  Uint32 UVar5;
  pointer pRVar6;
  pointer pRVar7;
  iterator __begin3;
  pointer pRVar8;
  RayTracingTriangleHitShaderGroup *Shader_1;
  pointer pRVar9;
  pointer pRVar10;
  pointer pRVar11;
  IShader **ppIVar12;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar13;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  local_48;
  
  pRVar8 = (pointer)(this->GeneralShaders).
                    super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (pointer)(this->GeneralShaders).
                    super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  pRVar4 = (pointer)0x0;
  UVar5 = (Uint32)((ulong)((long)pRVar1 - (long)pRVar8) >> 4);
  pRVar6 = pRVar8;
  if (UVar5 == 0) {
    pRVar6 = pRVar4;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount = UVar5;
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pGeneralShaders = (RayTracingGeneralShaderGroup *)pRVar6
  ;
  pRVar6 = (pointer)(this->TriangleHitShaders).
                    super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  pRVar9 = (pointer)(this->TriangleHitShaders).
                    super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  UVar5 = (int)((ulong)((long)pRVar6 - (long)pRVar9) >> 3) * -0x55555555;
  pRVar7 = pRVar9;
  if (UVar5 == 0) {
    pRVar7 = pRVar4;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount = UVar5;
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pTriangleHitShaders =
       (RayTracingTriangleHitShaderGroup *)pRVar7;
  pRVar7 = (this->ProceduralHitShaders).
           super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  UVar5 = (Uint32)((ulong)((long)(this->ProceduralHitShaders).
                                 super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar7) >> 5);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount = UVar5;
  if (UVar5 == 0) {
    pRVar7 = pRVar4;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pProceduralHitShaders = pRVar7;
  if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != SYNC_FLAG_NONE) {
    if (pRVar8 != pRVar1) {
      do {
        pVar13 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&(this->
                                super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                                ).StringPool,pRVar8,pRVar7);
        pRVar7 = pVar13._8_8_;
        pRVar8->Name = *(Char **)((long)pVar13.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pRVar8 = (pointer)&pRVar8->pClosestHitShader;
      } while (pRVar8 != pRVar1);
      pRVar9 = (pointer)(this->TriangleHitShaders).
                        super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      pRVar6 = (pointer)(this->TriangleHitShaders).
                        super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pRVar9 != pRVar6) {
      do {
        pVar13 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&(this->
                                super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                                ).StringPool,pRVar9,pRVar7);
        pRVar7 = pVar13._8_8_;
        pRVar9->Name = *(Char **)((long)pVar13.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pRVar9 = (pointer)&pRVar9->pAnyHitShader;
      } while (pRVar9 != pRVar6);
    }
    pRVar8 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar8 != pRVar1) {
      do {
        pVar13 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<char_const*&>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&(this->
                                super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                                ).StringPool,pRVar8,pRVar7);
        pRVar7 = pVar13._8_8_;
        pRVar8->Name = *(Char **)((long)pVar13.first.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                        ._M_cur.
                                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 + 8);
        pRVar8 = pRVar8 + 1;
      } while (pRVar8 != pRVar1);
    }
    if ((this->
        super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
        ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName != (Char *)0x0) {
      pVar13 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)&(this->
                              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                              ).StringPool,
                          &(this->
                           super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                           ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName,pRVar7);
      (this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName =
           *(Char **)((long)pVar13.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
  }
  if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != SYNC_FLAG_NONE) {
    this_00 = &this->ShaderObjects;
    local_48.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::_M_erase_at_end(this_00,(pointer)0x0);
    pRVar10 = (this->GeneralShaders).
              super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->GeneralShaders).
             super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar10 != pRVar2) {
      ppIVar12 = &pRVar10->pShader;
      do {
        if (*ppIVar12 != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar12);
        }
        pRVar10 = (pointer)(ppIVar12 + 1);
        ppIVar12 = ppIVar12 + 2;
      } while (pRVar10 != pRVar2);
    }
    pRVar11 = (this->TriangleHitShaders).
              super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (this->TriangleHitShaders).
             super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar11 != pRVar3) {
      ppIVar12 = &pRVar11->pAnyHitShader;
      do {
        if (ppIVar12[-1] != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar12 + -1);
        }
        if (*ppIVar12 != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar12);
        }
        pRVar11 = (pointer)(ppIVar12 + 1);
        ppIVar12 = ppIVar12 + 3;
      } while (pRVar11 != pRVar3);
    }
    pRVar8 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar1 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar8 != pRVar1) {
      ppIVar12 = &pRVar8->pAnyHitShader;
      do {
        if (ppIVar12[-2] != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar12 + -2);
        }
        if (ppIVar12[-1] != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar12 + -1);
        }
        if (*ppIVar12 != (IShader *)0x0) {
          std::
          vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
          ::emplace_back<Diligent::IShader*&>
                    ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                      *)this_00,ppIVar12);
        }
        pRVar8 = (pointer)(ppIVar12 + 1);
        ppIVar12 = ppIVar12 + 4;
      } while (pRVar8 != pRVar1);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::~vector(&local_48);
  }
  return this;
}

Assistant:

RayTracingPipelineStateCreateInfoX& SyncDesc(SYNC_FLAGS UpdateFlags)
    {
        GeneralShaderCount = static_cast<Uint32>(GeneralShaders.size());
        pGeneralShaders    = GeneralShaderCount > 0 ? GeneralShaders.data() : nullptr;

        TriangleHitShaderCount = static_cast<Uint32>(TriangleHitShaders.size());
        pTriangleHitShaders    = TriangleHitShaderCount > 0 ? TriangleHitShaders.data() : nullptr;

        ProceduralHitShaderCount = static_cast<Uint32>(ProceduralHitShaders.size());
        pProceduralHitShaders    = ProceduralHitShaderCount > 0 ? ProceduralHitShaders.data() : nullptr;

        if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != 0)
        {
            for (auto& Shader : GeneralShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : TriangleHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : ProceduralHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            if (pShaderRecordName != nullptr)
                pShaderRecordName = StringPool.emplace(pShaderRecordName).first->c_str();
        }

        if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != 0)
        {
            // Keep current shader objects alive
            std::vector<RefCntAutoPtr<IShader>> OldShaderObjects = std::move(ShaderObjects);

            ShaderObjects.clear();
            for (auto& Shader : GeneralShaders)
            {
                if (Shader.pShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pShader);
            }

            for (auto& Shader : TriangleHitShaders)
            {
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }

            for (auto& Shader : ProceduralHitShaders)
            {
                if (Shader.pIntersectionShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pIntersectionShader);
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }
        }

        return *this;
    }